

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O3

void number_suite::test_unsigned_double_zero(void)

{
  return;
}

Assistant:

void test_unsigned_double_zero()
{
#if defined(TRIAL_PROTOCOL_JSON_WITH_UNSIGNED_CHAR)
    unsigned_ostringstream buffer;
    unsigned_encoder_type encoder(buffer);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(0.0), 16);
    unsigned char expect[] = { '0', '.', '0', '0', '0', '0', '0', '0', '0', '0', '0', '0', '0', '0', '0', '0' };
    unsigned_string result = buffer.str();
    TRIAL_PROTOCOL_TEST_ALL_EQUAL(result.begin(), result.end(),
                                  expect, expect + sizeof(expect));
#endif
}